

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Audio.cpp
# Opt level: O2

bool __thiscall
Amiga::Audio::Channel::output<(Amiga::Audio::Channel::State)3>(Channel *this,Channel *moduland)

{
  bool bVar1;
  
  if (this->period_counter != 1) {
    this->period_counter = this->period_counter - 1;
    return false;
  }
  this->state = PlayingLow;
  this->output_level = (int8_t)this->data_latch;
  if (this->attach_period == true) {
    this->data_latch = this->data;
    if (moduland != (Channel *)0x0) {
      moduland->period = this->data;
    }
    bVar1 = true;
    if (this->dma_enabled != true) goto LAB_001fc23e;
    this->wants_data = true;
    if (this->will_request_interrupt == true) {
      this->will_request_interrupt = false;
      goto LAB_001fc23e;
    }
  }
  bVar1 = false;
LAB_001fc23e:
  this->period_counter = this->period;
  decrement_length(this);
  return bVar1;
}

Assistant:

bool Audio::Channel::output<Audio::Channel::State::PlayingHigh>(Channel *moduland) {
	// This is a reasonable guess as to the exit condition for this node;
	// Commodore doesn't document.
	if(period_counter == 1) {
		return transit<State::PlayingHigh, State::PlayingLow>(moduland);
	}

	// percount.
	-- period_counter;

	return false;
}